

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationruleparser.cpp
# Opt level: O0

int32_t __thiscall
icu_63::CollationRuleParser::parseRelationOperator(CollationRuleParser *this,UErrorCode *errorCode)

{
  int iVar1;
  UBool UVar2;
  char16_t cVar3;
  int32_t iVar4;
  int local_28;
  uint uStack_24;
  UChar c;
  int32_t i;
  int32_t strength;
  UErrorCode *errorCode_local;
  CollationRuleParser *this_local;
  
  UVar2 = ::U_FAILURE(*errorCode);
  if (UVar2 == '\0') {
    iVar4 = skipWhiteSpace(this,this->ruleIndex);
    this->ruleIndex = iVar4;
    iVar1 = this->ruleIndex;
    iVar4 = icu_63::UnicodeString::length(this->rules);
    if (iVar1 < iVar4) {
      iVar1 = this->ruleIndex;
      local_28 = iVar1 + 1;
      cVar3 = icu_63::UnicodeString::charAt(this->rules,iVar1);
      switch(cVar3) {
      case L',':
        uStack_24 = 2;
        break;
      default:
        return -1;
      case L';':
        uStack_24 = 1;
        break;
      case L'<':
        iVar4 = icu_63::UnicodeString::length(this->rules);
        if ((local_28 < iVar4) &&
           (cVar3 = icu_63::UnicodeString::charAt(this->rules,local_28), cVar3 == L'<')) {
          local_28 = iVar1 + 2;
          iVar4 = icu_63::UnicodeString::length(this->rules);
          if ((local_28 < iVar4) &&
             (cVar3 = icu_63::UnicodeString::charAt(this->rules,local_28), cVar3 == L'<')) {
            local_28 = iVar1 + 3;
            iVar4 = icu_63::UnicodeString::length(this->rules);
            if ((local_28 < iVar4) &&
               (cVar3 = icu_63::UnicodeString::charAt(this->rules,local_28), cVar3 == L'<')) {
              local_28 = iVar1 + 4;
              uStack_24 = 3;
            }
            else {
              uStack_24 = 2;
            }
          }
          else {
            uStack_24 = 1;
          }
        }
        else {
          uStack_24 = 0;
        }
        iVar4 = icu_63::UnicodeString::length(this->rules);
        if ((local_28 < iVar4) &&
           (cVar3 = icu_63::UnicodeString::charAt(this->rules,local_28), cVar3 == L'*')) {
          local_28 = local_28 + 1;
          uStack_24 = uStack_24 | 0x10;
        }
        break;
      case L'=':
        uStack_24 = 0xf;
        iVar4 = icu_63::UnicodeString::length(this->rules);
        if ((local_28 < iVar4) &&
           (cVar3 = icu_63::UnicodeString::charAt(this->rules,local_28), cVar3 == L'*')) {
          local_28 = iVar1 + 2;
          uStack_24 = 0x1f;
        }
      }
      this_local._4_4_ = (local_28 - this->ruleIndex) * 0x100 | uStack_24;
    }
    else {
      this_local._4_4_ = 0xffffffff;
    }
  }
  else {
    this_local._4_4_ = 0xffffffff;
  }
  return this_local._4_4_;
}

Assistant:

int32_t
CollationRuleParser::parseRelationOperator(UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return UCOL_DEFAULT; }
    ruleIndex = skipWhiteSpace(ruleIndex);
    if(ruleIndex >= rules->length()) { return UCOL_DEFAULT; }
    int32_t strength;
    int32_t i = ruleIndex;
    UChar c = rules->charAt(i++);
    switch(c) {
    case 0x3c:  // '<'
        if(i < rules->length() && rules->charAt(i) == 0x3c) {  // <<
            ++i;
            if(i < rules->length() && rules->charAt(i) == 0x3c) {  // <<<
                ++i;
                if(i < rules->length() && rules->charAt(i) == 0x3c) {  // <<<<
                    ++i;
                    strength = UCOL_QUATERNARY;
                } else {
                    strength = UCOL_TERTIARY;
                }
            } else {
                strength = UCOL_SECONDARY;
            }
        } else {
            strength = UCOL_PRIMARY;
        }
        if(i < rules->length() && rules->charAt(i) == 0x2a) {  // '*'
            ++i;
            strength |= STARRED_FLAG;
        }
        break;
    case 0x3b:  // ';' same as <<
        strength = UCOL_SECONDARY;
        break;
    case 0x2c:  // ',' same as <<<
        strength = UCOL_TERTIARY;
        break;
    case 0x3d:  // '='
        strength = UCOL_IDENTICAL;
        if(i < rules->length() && rules->charAt(i) == 0x2a) {  // '*'
            ++i;
            strength |= STARRED_FLAG;
        }
        break;
    default:
        return UCOL_DEFAULT;
    }
    return ((i - ruleIndex) << OFFSET_SHIFT) | strength;
}